

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O0

void handle_irq(arm7tdmi_t *state)

{
  int iVar1;
  long in_RDI;
  status_register_t cpsr;
  uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  IRQ!\n\x1b[0;m");
  }
  uVar2 = *(uint *)(in_RDI + 0xb4);
  *(undefined1 *)(in_RDI + 0xd9) = 0;
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffe0 | 0x12;
  set_spsr((arm7tdmi_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffdf;
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffff7f | 0x80;
  iVar1 = 4;
  if ((uVar2 >> 5 & 1) != 0) {
    iVar1 = 2;
  }
  *(int *)(in_RDI + 0xa8) = (*(int *)(in_RDI + 0xb0) - iVar1) + 4;
  set_pc((arm7tdmi_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void handle_irq(arm7tdmi_t* state) {
    logwarn("IRQ!")
    status_register_t cpsr = state->cpsr;
    state->halt = false;
    state->cpsr.mode = MODE_IRQ;
    set_spsr(state, cpsr.raw);
    state->cpsr.thumb = 0;
    state->cpsr.disable_irq = 1;
    state->lr_irq = state->pc - (cpsr.thumb ? 2 : 4) + 4;
    set_pc(state, 0x18); // IRQ handler
}